

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pDrawCallBatchingTests.cpp
# Opt level: O0

deUint64 __thiscall
deqp::gles2::Performance::anon_unknown_0::DrawCallBatchingTest::renderBatched
          (DrawCallBatchingTest *this)

{
  value_type vVar1;
  int iVar2;
  code *pcVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 uVar6;
  value_type_conflict1 vVar7;
  undefined4 extraout_var;
  undefined8 uVar9;
  reference pvVar10;
  reference pvVar11;
  reference pvVar12;
  deUint64 dVar13;
  reference pvVar14;
  reference pvVar15;
  int local_134;
  undefined1 local_130 [4];
  int attribNdx_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined4 local_ec;
  int local_e8;
  GLint location_2;
  int attribNdx_2;
  int attribute;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  value_type_conflict1 local_a0;
  int local_9c;
  GLint location_1;
  int attribNdx_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined4 local_54;
  int local_50;
  GLint location;
  int attribNdx;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> dynamicAttributeLocations;
  deUint64 endUs;
  deUint64 beginUs;
  Functions *gl;
  DrawCallBatchingTest *this_local;
  long lVar8;
  
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar4);
  dynamicAttributeLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_40);
  (**(code **)(lVar8 + 0x1a00))(0,0,0x20);
  pcVar3 = *(code **)(lVar8 + 0x1680);
  dVar5 = glu::ShaderProgram::getProgram(this->m_program);
  (*pcVar3)(dVar5);
  for (local_50 = 0; local_50 < (this->m_spec).staticAttributeCount; local_50 = local_50 + 1) {
    pcVar3 = *(code **)(lVar8 + 0x780);
    dVar5 = glu::ShaderProgram::getProgram(this->m_program);
    de::toString<int>((string *)&location_1,&local_50);
    std::operator+(&local_78,"a_static",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&location_1)
    ;
    uVar9 = std::__cxx11::string::c_str();
    uVar6 = (*pcVar3)(dVar5,uVar9);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&location_1);
    local_54 = uVar6;
    (**(code **)(lVar8 + 0x610))(uVar6);
    uVar6 = local_54;
    if (((this->m_spec).useStaticBuffer & 1U) == 0) {
      pcVar3 = *(code **)(lVar8 + 0x19f0);
      pvVar11 = std::
                vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
                ::operator[](&this->m_staticAttributeDatas,(long)local_50);
      pvVar12 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[](pvVar11,0);
      (*pcVar3)(uVar6,4,0x1400,1,0,pvVar12);
    }
    else {
      pcVar3 = *(code **)(lVar8 + 0x40);
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&this->m_batchedStaticBuffers,(long)local_50);
      (*pcVar3)(0x8892,*pvVar10);
      (**(code **)(lVar8 + 0x19f0))(local_54,4,0x1400,1,0,0);
      (**(code **)(lVar8 + 0x40))(0x8892,0);
    }
  }
  for (local_9c = 0; local_9c < (this->m_spec).dynamicAttributeCount; local_9c = local_9c + 1) {
    pcVar3 = *(code **)(lVar8 + 0x780);
    dVar5 = glu::ShaderProgram::getProgram(this->m_program);
    de::toString<int>((string *)&attribNdx_2,&local_9c);
    std::operator+(&local_c0,"a_dyn",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&attribNdx_2
                  );
    uVar9 = std::__cxx11::string::c_str();
    vVar7 = (*pcVar3)(dVar5,uVar9);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&attribNdx_2);
    local_a0 = vVar7;
    (**(code **)(lVar8 + 0x610))(vVar7);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_40,&local_a0);
  }
  if (((((this->m_spec).useDrawElements & 1U) != 0) && (((this->m_spec).useIndexBuffer & 1U) != 0))
     && (((this->m_spec).dynamicIndices & 1U) == 0)) {
    (**(code **)(lVar8 + 0x40))(0x8893,this->m_batchedStaticIndexBuffer);
  }
  dVar5 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar5,"Failed to setup initial state for rendering.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                  ,0x2d2);
  (**(code **)(lVar8 + 0x648))();
  dVar13 = deGetMicroseconds();
  for (location_2 = 0; location_2 < (this->m_spec).dynamicAttributeCount;
      location_2 = location_2 + 1) {
    if (((this->m_spec).useDynamicBuffer & 1U) == 0) {
      pcVar3 = *(code **)(lVar8 + 0x19f0);
      pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_40,(long)location_2);
      vVar1 = *pvVar14;
      pvVar11 = std::
                vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
                ::operator[](&this->m_dynamicAttributeDatas,(long)location_2);
      pvVar12 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[](pvVar11,0);
      (*pcVar3)(vVar1,4,0x1400,1,0,pvVar12);
    }
    else {
      pcVar3 = *(code **)(lVar8 + 0x40);
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&this->m_batchedDynamicBuffers,(long)location_2);
      (*pcVar3)(0x8892,*pvVar10);
      pcVar3 = *(code **)(lVar8 + 0x19f0);
      pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_40,(long)location_2);
      (*pcVar3)(*pvVar14,4,0x1400,1,0,0);
      (**(code **)(lVar8 + 0x40))(0x8892);
    }
  }
  if (((this->m_spec).useDrawElements & 1U) == 0) {
    (**(code **)(lVar8 + 0x538))
              (4,0,(this->m_spec).triangleCount * (this->m_spec).drawCallCount * 3);
  }
  else if (((this->m_spec).useIndexBuffer & 1U) == 0) {
    if (((this->m_spec).dynamicIndices & 1U) == 0) {
      pcVar3 = *(code **)(lVar8 + 0x568);
      iVar4 = (this->m_spec).triangleCount;
      iVar2 = (this->m_spec).drawCallCount;
      pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          (&this->m_staticIndexData,0);
      (*pcVar3)(4,iVar4 * iVar2 * 3,0x1401,pvVar15);
    }
    else {
      pcVar3 = *(code **)(lVar8 + 0x568);
      iVar4 = (this->m_spec).triangleCount;
      iVar2 = (this->m_spec).drawCallCount;
      pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          (&this->m_dynamicIndexData,0);
      (*pcVar3)(4,iVar4 * iVar2 * 3,0x1401,pvVar15);
    }
  }
  else if (((this->m_spec).dynamicIndices & 1U) == 0) {
    (**(code **)(lVar8 + 0x568))
              (4,(this->m_spec).triangleCount * (this->m_spec).drawCallCount * 3,0x1401,0);
  }
  else {
    (**(code **)(lVar8 + 0x40))(0x8893,this->m_batchedDynamicIndexBuffer);
    (**(code **)(lVar8 + 0x568))
              (4,(this->m_spec).triangleCount * (this->m_spec).drawCallCount * 3,0x1401,0);
    (**(code **)(lVar8 + 0x40))(0x8893,0);
  }
  (**(code **)(lVar8 + 0x648))();
  dynamicAttributeLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)deGetMicroseconds();
  dVar5 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar5,"Batched rendering failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                  ,0x300);
  (**(code **)(lVar8 + 0x40))(0x8893,0);
  for (local_e8 = 0; local_e8 < (this->m_spec).staticAttributeCount; local_e8 = local_e8 + 1) {
    pcVar3 = *(code **)(lVar8 + 0x780);
    dVar5 = glu::ShaderProgram::getProgram(this->m_program);
    de::toString<int>((string *)local_130,&local_e8);
    std::operator+(&local_110,"a_static",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130);
    uVar9 = std::__cxx11::string::c_str();
    uVar6 = (*pcVar3)(dVar5,uVar9);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)local_130);
    local_ec = uVar6;
    (**(code **)(lVar8 + 0x518))(uVar6);
  }
  for (local_134 = 0; local_134 < (this->m_spec).dynamicAttributeCount; local_134 = local_134 + 1) {
    pcVar3 = *(code **)(lVar8 + 0x518);
    pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_40,(long)local_134);
    (*pcVar3)(*pvVar14);
  }
  dVar5 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar5,"Failed to reset state after batched rendering",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                  ,0x30d);
  dVar13 = (long)dynamicAttributeLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage - dVar13;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  return dVar13;
}

Assistant:

deUint64 DrawCallBatchingTest::renderBatched (void)
{
	const glw::Functions&	gl		= m_renderCtx.getFunctions();
	deUint64				beginUs	= 0;
	deUint64				endUs	= 0;
	vector<GLint>			dynamicAttributeLocations;

	gl.viewport(0, 0, 32, 32);
	gl.useProgram(m_program->getProgram());

	// Setup static buffers
	for (int attribNdx = 0; attribNdx < m_spec.staticAttributeCount; attribNdx++)
	{
		GLint location = gl.getAttribLocation(m_program->getProgram(), ("a_static" + de::toString(attribNdx)).c_str());

		gl.enableVertexAttribArray(location);

		if (m_spec.useStaticBuffer)
		{
			gl.bindBuffer(GL_ARRAY_BUFFER, m_batchedStaticBuffers[attribNdx]);
			gl.vertexAttribPointer(location, 4, GL_BYTE, GL_TRUE, 0, NULL);
			gl.bindBuffer(GL_ARRAY_BUFFER, 0);
		}
		else
			gl.vertexAttribPointer(location, 4, GL_BYTE, GL_TRUE, 0, &(m_staticAttributeDatas[attribNdx][0]));
	}

	// Get locations of dynamic attributes
	for (int attribNdx = 0; attribNdx < m_spec.dynamicAttributeCount; attribNdx++)
	{
		GLint location = gl.getAttribLocation(m_program->getProgram(), ("a_dyn" + de::toString(attribNdx)).c_str());

		gl.enableVertexAttribArray(location);
		dynamicAttributeLocations.push_back(location);
	}

	if (m_spec.useDrawElements && m_spec.useIndexBuffer && !m_spec.dynamicIndices)
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_batchedStaticIndexBuffer);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup initial state for rendering.");

	gl.finish();

	beginUs = deGetMicroseconds();

	for (int attribute = 0; attribute < m_spec.dynamicAttributeCount; attribute++)
	{
		if (m_spec.useDynamicBuffer)
		{
			gl.bindBuffer(GL_ARRAY_BUFFER, m_batchedDynamicBuffers[attribute]);
			gl.vertexAttribPointer(dynamicAttributeLocations[attribute], 4, GL_BYTE, GL_TRUE, 0, NULL);
			gl.bindBuffer(GL_ARRAY_BUFFER, 0);
		}
		else
			gl.vertexAttribPointer(dynamicAttributeLocations[attribute], 4, GL_BYTE, GL_TRUE, 0, &(m_dynamicAttributeDatas[attribute][0]));
	}

	if (m_spec.useDrawElements)
	{
		if (m_spec.useIndexBuffer)
		{
			if (m_spec.dynamicIndices)
			{
				gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_batchedDynamicIndexBuffer);
				gl.drawElements(GL_TRIANGLES, m_spec.triangleCount * 3 * m_spec.drawCallCount, GL_UNSIGNED_BYTE, NULL);
				gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
			}
			else
				gl.drawElements(GL_TRIANGLES, m_spec.triangleCount * 3 * m_spec.drawCallCount, GL_UNSIGNED_BYTE, NULL);
		}
		else
		{
			if (m_spec.dynamicIndices)
				gl.drawElements(GL_TRIANGLES, m_spec.triangleCount * 3 * m_spec.drawCallCount, GL_UNSIGNED_BYTE, &(m_dynamicIndexData[0]));
			else
				gl.drawElements(GL_TRIANGLES, m_spec.triangleCount * 3 * m_spec.drawCallCount, GL_UNSIGNED_BYTE, &(m_staticIndexData[0]));
		}
	}
	else
		gl.drawArrays(GL_TRIANGLES, 0, 3 * m_spec.triangleCount * m_spec.drawCallCount);

	gl.finish();

	endUs = deGetMicroseconds();

	GLU_EXPECT_NO_ERROR(gl.getError(), "Batched rendering failed");

	gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);

	for (int attribNdx = 0; attribNdx < m_spec.staticAttributeCount; attribNdx++)
	{
		GLint location = gl.getAttribLocation(m_program->getProgram(), ("a_static" + de::toString(attribNdx)).c_str());
		gl.disableVertexAttribArray(location);
	}

	for (int attribNdx = 0; attribNdx < m_spec.dynamicAttributeCount; attribNdx++)
		gl.disableVertexAttribArray(dynamicAttributeLocations[attribNdx]);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to reset state after batched rendering");

	return endUs - beginUs;
}